

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

Value * __thiscall Json::Value::removeMember(Value *__return_storage_ptr__,Value *this,char *key)

{
  size_t sVar1;
  undefined8 extraout_RAX;
  ostringstream oss;
  string local_1b0;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  if (this->field_0x8 == '\0') {
    Value(__return_storage_ptr__,(Value *)kNull);
  }
  else {
    if (this->field_0x8 != '\b') {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"in Json::Value::removeMember(): requires objectValue",0x34);
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream(local_190);
      std::ios_base::~ios_base(local_120);
      _Unwind_Resume(extraout_RAX);
    }
    *(ushort *)&__return_storage_ptr__->field_0x8 =
         *(ushort *)&__return_storage_ptr__->field_0x8 & 0xfe00;
    __return_storage_ptr__->comments_ = (CommentInfo *)0x0;
    __return_storage_ptr__->start_ = 0;
    __return_storage_ptr__->limit_ = 0;
    sVar1 = strlen(key);
    removeMember(this,key,key + sVar1,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Value Value::removeMember(const char* key)
{
  JSON_ASSERT_MESSAGE(type_ == nullValue || type_ == objectValue,
                      "in Json::Value::removeMember(): requires objectValue");
  if (type_ == nullValue)
    return nullRef;

  Value removed;  // null
  removeMember(key, key + strlen(key), &removed);
  return removed; // still null if removeMember() did nothing
}